

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsha1.c
# Opt level: O3

int lsha1(lua_State *L)

{
  uint8_t *data;
  size_t sz;
  uint8_t digest [20];
  size_t local_a0;
  uint8_t local_98 [32];
  SHA1_CTX local_78;
  
  local_a0 = 0;
  data = (uint8_t *)luaL_checklstring(L,1,&local_a0);
  local_78.state[0] = 0x67452301;
  local_78.state[1] = 0xefcdab89;
  local_78.state[2] = 0x98badcfe;
  local_78.state[3] = 0x10325476;
  local_78.state[4] = 0xc3d2e1f0;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  sat_SHA1_Update(&local_78,data,local_a0);
  sat_SHA1_Final(&local_78,local_98);
  lua_pushlstring(L,(char *)local_98,0x14);
  return 1;
}

Assistant:

int
lsha1(lua_State *L) {
	size_t sz = 0;
	const uint8_t * buffer = (const uint8_t *)luaL_checklstring(L, 1, &sz);
	uint8_t digest[SHA1_DIGEST_SIZE];
	SHA1_CTX ctx;
	sat_SHA1_Init(&ctx);
	sat_SHA1_Update(&ctx, buffer, sz);
	sat_SHA1_Final(&ctx, digest);
	lua_pushlstring(L, (const char *)digest, SHA1_DIGEST_SIZE);

	return 1;
}